

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  char local_c8 [8];
  char any_address [128];
  int local_3c;
  long lStack_38;
  int i;
  size_t sz;
  int local_28;
  int opt;
  int sb2;
  int sc;
  int sb;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _sb = argv;
  argv_local._0_4_ = argc;
  iVar2 = get_test_port(argc,argv);
  test_addr_from(socket_address,"ws","127.0.0.1",iVar2);
  iVar2 = get_test_port((int)argv_local,_sb);
  test_addr_from(local_c8,"ws","*",iVar2);
  sb2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0x5e,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0x5f,sb2,local_c8);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0x60,sb2);
  opt = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,100,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                    ,0x65,opt,socket_address);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0x66,opt);
  opt = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0x69,1,0x10);
  lStack_38 = 4;
  sc = nn_getsockopt(opt,0xfffffffc,1,(long)&sz + 4,&stack0xffffffffffffffc8);
  if (sc != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x6e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (lStack_38 != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (opt)",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x6f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ != 2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opt == NN_WS_MSG_TYPE_BINARY",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x70);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://127.0.0.1");
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x74);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://*:");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x78);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x79);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://*:1000000");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x7b);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x7c);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://*:some_port");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x7e);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://eth10000;127.0.0.1:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x80);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x13) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x81);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(opt,"ws://127.0.0.1:");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x84);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x85);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(opt,"ws://127.0.0.1:1000000");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x87);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x88);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(opt,"ws://eth10000:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x8a);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x13) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x8b);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x8e);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x8f);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://-hostname:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x91);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x92);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://abc.123.---.#:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x94);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x95);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://[::1]:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x97);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x98);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://abc...123:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x9a);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x9b);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(opt,"ws://.123:5555");
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x9d);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0x9e);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xa0,opt);
  sb2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xa2,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xa3,sb2,socket_address);
  opt = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xa4,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                    ,0xa5,opt,socket_address);
  for (local_3c = 0; local_3c != 100; local_3c = local_3c + 1) {
    test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xaa,opt,"ABC");
    test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xab,sb2,"ABC");
    test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xad,sb2,"DEF");
    test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xae,opt,"DEF");
  }
  for (local_3c = 0; local_3c != 100; local_3c = local_3c + 1) {
    test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xb3,opt,"0123456789012345678901234567890123456789");
  }
  for (local_3c = 0; local_3c != 100; local_3c = local_3c + 1) {
    test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                   0xb6,sb2,"0123456789012345678901234567890123456789");
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xb9,opt);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xba,sb2);
  sb2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xbd,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xbe,sb2,socket_address);
  local_28 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                              ,0xbf,1,0x10);
  sc = nn_bind(local_28,socket_address);
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xc2);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x62) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xc3);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xc4,sb2);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xc5,local_28);
  sb2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,200,1,0x10);
  sz._4_4_ = 0xffffffff;
  sc = nn_setsockopt(sb2,0,0x10,(long)&sz + 4,4);
  if (sc < 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc >= 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xcb);
    fflush(_stderr);
    nn_err_abort();
  }
  sz._4_4_ = 0xfffffffe;
  sc = nn_setsockopt(sb2,0,0x10,(long)&sz + 4,4);
  if (-1 < sc) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xce);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  if (iVar2 != 0x16) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xcf);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xd0,sb2);
  sb2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xd3,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xd4,sb2,socket_address);
  opt = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xd5,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                    ,0xd6,opt,socket_address);
  sz._4_4_ = 1000;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xd8,
             opt,0,4,(void *)((long)&sz + 4),4);
  if (sz._4_4_ != 1000) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opt == 1000",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xd9);
    fflush(_stderr);
    nn_err_abort();
  }
  sz._4_4_ = 1000;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xdb,
             sb2,0,5,(void *)((long)&sz + 4),4);
  if (sz._4_4_ != 1000) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opt == 1000",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xdc);
    fflush(_stderr);
    nn_err_abort();
  }
  sz._4_4_ = 4;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xde,
             sb2,0,0x10,(void *)((long)&sz + 4),4);
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xdf,opt,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xe0,sb2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xe1,opt,"ABCD");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xe2,sb2,"ABCD");
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xe3,opt,"ABCDE");
  test_drop_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xe4,sb2,0x6e);
  sz._4_4_ = 5;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",0xea,
             sb2,0,0x10,(void *)((long)&sz + 4),4);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                    ,0xeb,opt,socket_address);
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xec,opt,"ABCDE");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                 0xed,sb2,"ABCDE");
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xee,sb2);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xef,opt);
  test_text();
  opt = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                         ,0xf4,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c"
                    ,0xf5,opt,socket_address);
  nn_sleep(100);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
                  0xf7,opt);
  return 0;
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int sb2;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from (socket_address, "ws", "127.0.0.1",
            get_test_port (argc, argv));

    test_addr_from (any_address, "ws", "*",
            get_test_port (argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sb2 = test_socket (AF_SP, NN_PAIR);

    rc = nn_bind (sb2, socket_address);
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EADDRINUSE);
    test_close(sb);
    test_close(sb2);

    /*  Test that NN_RCVMAXSIZE can be -1, but not lower */
    sb = test_socket (AF_SP, NN_PAIR);
    opt = -1;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc >= 0);
    opt = -2;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    test_close (sb);

    /*  Test NN_RCVMAXSIZE limit */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    opt = 1000;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 1000;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 4;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_send (sc, "ABC");
    test_recv (sb, "ABC");
    test_send (sc, "ABCD");
    test_recv (sb, "ABCD");
    test_send (sc, "ABCDE");
    test_drop (sb, ETIMEDOUT);

    /*  Increase the size limit, reconnect, then try sending again. The reason a
        reconnect is necessary is because after a protocol violation, the
        connecting socket will not continue automatic reconnection attempts. */
    opt = 5;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_connect (sc, socket_address);
    test_send (sc, "ABCDE");
    test_recv (sb, "ABCDE");
    test_close (sb);
    test_close (sc);

    test_text ();

    /*  Test closing a socket that is waiting to connect. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    nn_sleep (100);
    test_close (sc);

    return 0;
}